

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * soul::Value::createUnsizedArray(Value *__return_storage_ptr__,Type *elementType,Handle h)

{
  Type TStack_48;
  PackedData local_30;
  
  if ((elementType->category == array) && (elementType->boundingSize == 0)) {
    throwInternalCompilerError("! elementType.isUnsizedArray()","createUnsizedArray",0x1ee);
  }
  Type::createUnsizedArray(&TStack_48,elementType);
  Value(__return_storage_ptr__,&TStack_48);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_48.structure);
  getData(&local_30,__return_storage_ptr__);
  PackedData::setAs<long>(&local_30,h);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createUnsizedArray (const Type& elementType, ConstantTable::Handle h)
{
    SOUL_ASSERT (! elementType.isUnsizedArray());  // this may need to be removed at some point, but is here as a useful sanity-check
    Value v (elementType.createUnsizedArray());
    v.getData().setAs (h);
    return v;
}